

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.h
# Opt level: O0

void __thiscall ser::DataFieldInfo::DataFieldInfo(DataFieldInfo *this)

{
  DataFieldInfo *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->type_);
  MetainfoSet::MetainfoSet(&this->metainfo_);
  std::__cxx11::string::operator=((string *)this,"");
  std::__cxx11::string::operator=((string *)&this->type_,"");
  this->bytesPerElement_ = 0;
  this->rank_ = 0;
  this->iSize_ = 1;
  this->jSize_ = 1;
  this->kSize_ = 1;
  this->lSize_ = 1;
  this->iPlusHalo_ = 0;
  this->jPlusHalo_ = 0;
  this->kPlusHalo_ = 0;
  this->lPlusHalo_ = 0;
  this->iMinusHalo_ = 0;
  this->jMinusHalo_ = 0;
  this->kMinusHalo_ = 0;
  this->lMinusHalo_ = 0;
  return;
}

Assistant:

DataFieldInfo()
        {
            name_ = "";
            type_ = "";
            bytesPerElement_ = 0;
            rank_ = 0;
            iSize_ = 1;
            jSize_ = 1;
            kSize_ = 1;
            lSize_ = 1;
            iPlusHalo_ = 0;
            jPlusHalo_ = 0;
            kPlusHalo_ = 0;
            lPlusHalo_ = 0;
            iMinusHalo_ = 0;
            jMinusHalo_ = 0;
            kMinusHalo_ = 0;
            lMinusHalo_ = 0;
        }